

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  session_interface *psVar1;
  bool bVar2;
  piece_index_t new_piece;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  element_type *peVar7;
  alert_manager *paVar8;
  element_type *peVar9;
  element_type *peVar10;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar11;
  ulong uVar12;
  size_type sVar13;
  type td;
  ulong uVar14;
  bool local_4ad;
  bool local_441;
  bool local_3f5;
  bool local_3b9;
  bool local_382;
  bool local_355;
  bool local_330;
  bool local_2fc;
  bool local_2e9;
  duration<long,_std::ratio<1L,_1L>_> local_278;
  duration<long,_std::ratio<1L,_1000000000L>_> local_270;
  int local_268 [2];
  int piece_timeout;
  int local_24c;
  duration<long,_std::ratio<1L,_1L>_> local_248;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_240;
  undefined1 local_231;
  error_code local_230;
  rep local_220;
  unique_ptr<libtorrent::peer_list,_std::default_delete<libtorrent::peer_list>_> local_218;
  error_code local_210;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_1fc;
  duration<long,_std::ratio<1L,_1L>_> local_1f8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f0;
  time_duration time_limit;
  time_duration d2;
  time_duration d1;
  error_code local_1d0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  error_code local_1b8;
  int local_1a4;
  duration<long,_std::ratio<1L,_1L>_> local_1a0;
  rep local_198;
  undefined1 local_189;
  error_code local_188;
  _List_node_base *local_178;
  duration<long,_std::ratio<1L,_1L>_> local_170;
  int local_168;
  undefined1 local_161;
  int timeout;
  size_t local_150;
  error_code local_148;
  int local_134;
  duration<long,_std::ratio<1L,_1L>_> local_130;
  uchar local_124;
  uchar local_123;
  bitfield_flag local_122;
  byte local_121;
  undefined1 local_120 [7];
  bool may_timeout;
  per_timer_data *local_110;
  error_code local_108;
  duration<long,_std::ratio<1L,_1L>_> local_f8;
  int local_ec;
  type tStack_e8;
  int connect_timeout;
  time_duration d;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range1;
  piece_index_t local_b8;
  int local_b4;
  duration<long,_std::ratio<1L,_1L>_> local_b0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  int local_9c;
  duration<long,_std::ratio<1L,_1L>_> local_98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  undefined4 local_88;
  undefined1 local_81;
  error_code local_80;
  performance_warning_t local_6c;
  undefined1 local_68 [24];
  int channel;
  uint local_44;
  undefined1 local_40 [4];
  int warning;
  shared_ptr<libtorrent::torrent> t;
  shared_ptr<libtorrent::peer_connection> me;
  time_point now;
  int tick_interval_ms_local;
  peer_connection *this_local;
  
  me.super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)libtorrent::aux::time_now();
  self((peer_connection *)
       &t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::weak_ptr<libtorrent::torrent>::lock((weak_ptr<libtorrent::torrent> *)local_40);
  local_44 = 0;
  bVar2 = libtorrent::aux::session_settings::get_bool
                    ((this->super_peer_connection_hot_members).m_settings,0x8010);
  if ((bVar2) && (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar2)
     ) {
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    uVar3 = stat::download_ip_overhead(&this->m_statistics);
    uVar5 = stat::upload_ip_overhead(&this->m_statistics);
    uVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x34])
                      (psVar1,&(this->super_peer_connection_hot_members).field_0x2c,(ulong)uVar3,
                       (ulong)uVar5);
    local_44 = local_44 | uVar3;
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
    uVar3 = stat::download_ip_overhead(&this->m_statistics);
    uVar5 = stat::upload_ip_overhead(&this->m_statistics);
    uVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x34])
                      (psVar1,&peVar7->super_peer_class_set,(ulong)uVar3,(ulong)uVar5);
    local_44 = uVar3 | local_44;
  }
  if (local_44 != 0) {
    peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    paVar8 = torrent::alerts(peVar7);
    bVar2 = alert_manager::should_post<libtorrent::performance_alert>(paVar8);
    if (bVar2) {
      for (local_68._16_4_ = 0; (int)local_68._16_4_ < 2; local_68._16_4_ = local_68._16_4_ + 1) {
        if ((local_44 & 1 << ((byte)local_68._16_4_ & 0x1f)) != 0) {
          peVar7 = std::
                   __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          paVar8 = torrent::alerts(peVar7);
          std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_40);
          torrent::get_handle((torrent *)local_68);
          local_6c = local_68._16_4_ == 1 | upload_limit_too_low;
          alert_manager::
          emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                    (paVar8,(torrent_handle *)local_68,&local_6c);
          torrent_handle::~torrent_handle((torrent_handle *)local_68);
        }
      }
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if ((!bVar2) || (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0)) {
    if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
      counters::inc_stats_counter(this->m_counters,0xe4,-1);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
      if (bVar2) {
        peVar7 = std::
                 __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        torrent::dec_num_connecting(peVar7,this->m_peer_info);
      }
      (this->super_peer_connection_hot_members).field_0x28 =
           (this->super_peer_connection_hot_members).field_0x28 & 0xfd;
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_80,torrent_aborted,(type *)0x0);
    local_81 = 0;
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_80,1,0);
    local_88 = 1;
    goto LAB_00329707;
  }
  local_2e9 = false;
  if ((((byte)(this->super_peer_connection_hot_members).field_0x28 >> 2 & 1) != 0) &&
     (local_2e9 = false, ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 4 & 1) != 0)
     ) {
    bVar2 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
            empty(&(this->m_download_queue).
                   super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 );
    local_2e9 = false;
    if (bVar2) {
      bVar2 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
              empty(&this->m_request_queue);
      local_2e9 = false;
      if (bVar2) {
        local_9c = 5;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_98,&local_9c);
        local_90 = std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&me.
                                  super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,&local_98);
        local_2e9 = std::chrono::operator>=(&local_90,&this->m_last_request);
      }
    }
  }
  if (local_2e9 != false) {
    (this->m_last_request).__d.__r =
         (rep)me.super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
    bVar2 = request_a_block(peVar7,this);
    if (bVar2) {
      counters::inc_stats_counter(this->m_counters,0x1f,1);
    }
    if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) {
      local_88 = 1;
      goto LAB_00329707;
    }
    send_block_requests(this);
  }
  peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  bVar2 = torrent::super_seeding(peVar7);
  local_2fc = false;
  if (bVar2) {
    peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    bVar2 = torrent::ready_for_connections(peVar7);
    local_2fc = false;
    if ((bVar2) && (local_2fc = false, (this->field_0x763 & 1) == 0)) {
      local_b4 = 10;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_b0,&local_b4);
      local_a8 = std::chrono::operator+(&this->m_became_uninterested,&local_b0);
      local_2fc = std::chrono::operator<
                            (&local_a8,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&me.
                                 super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
    }
  }
  if (local_2fc != false) {
    libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              (&local_b8,-1);
    peVar7 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    new_piece = torrent::get_piece_to_super_seed
                          (peVar7,&(this->super_peer_connection_hot_members).m_have_piece);
    superseed_piece(this,local_b8,new_piece);
  }
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])();
  uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar3 & 1) != 0) {
    local_88 = 1;
    goto LAB_00329707;
  }
  __end1 = std::__cxx11::
           list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
           ::begin(&this->m_extensions);
  e = (shared_ptr<libtorrent::peer_plugin> *)
      std::__cxx11::
      list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
      ::end(&this->m_extensions);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&e), bVar2) {
    d.__r = (rep)std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*(&__end1);
    peVar9 = std::
             __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)d.__r);
    (*peVar9->_vptr_peer_plugin[0x1e])();
    std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end1);
  }
  uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar3 & 1) != 0) {
    local_88 = 1;
    goto LAB_00329707;
  }
  tStack_e8 = std::chrono::operator-
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&me.
                             super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,&this->m_last_receive);
  if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
    local_ec = libtorrent::aux::session_settings::get_int
                         ((this->super_peer_connection_hot_members).m_settings,0x4011);
    if (this->m_peer_info != (torrent_peer *)0x0) {
      local_ec = (*(uint *)&this->m_peer_info->field_0x1b & 0x1f) * 3 + local_ec;
    }
    peVar10 = std::
              __shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socket);
    bVar2 = libtorrent::aux::is_ssl(peVar10);
    if (bVar2) {
      local_ec = local_ec + 10;
    }
    peVar10 = std::
              __shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socket);
    bVar2 = libtorrent::aux::is_i2p(peVar10);
    if (bVar2) {
      local_ec = local_ec + 0x14;
    }
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_f8,&local_ec);
    bVar2 = std::chrono::operator>(&stack0xffffffffffffff18,&local_f8);
    local_330 = false;
    if (bVar2) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_108,timed_out,(type *)0x0);
      local_330 = can_disconnect(this,&local_108);
    }
    if (local_330 != false) {
      local_110 = (per_timer_data *)tStack_e8.__r;
      uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)tStack_e8.__r);
      peer_log(this,info,"CONNECT_FAILED","waited %d seconds",uVar14 & 0xffffffff);
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)local_120,timed_out,(type *)0x0);
      connect_failed(this,(error_code *)local_120);
      local_88 = 1;
      goto LAB_00329707;
    }
  }
  local_123 = this->m_channel_state[1].m_val;
  local_124 = '\x04';
  local_122 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>)
                         local_123,
                         (bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>)
                         '\x04');
  local_121 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_122);
  local_355 = false;
  if ((bool)local_121) {
    local_134 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])();
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_130,&local_134);
    bVar2 = std::chrono::operator>(&stack0xffffffffffffff18,&local_130);
    local_355 = false;
    if (((bVar2) &&
        (local_355 = false,
        ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)) &&
       (local_355 = false, this->m_reading_bytes == 0)) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_148,timed_out_inactivity,(type *)0x0);
      local_355 = can_disconnect(this,&local_148);
    }
  }
  if (local_355 != false) {
    local_150 = tStack_e8.__r;
    uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)tStack_e8.__r);
    peer_log(this,info,"LAST_ACTIVITY","%d seconds ago",uVar14 & 0xffffffff);
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&timeout,timed_out_inactivity,(type *)0x0);
    local_161 = 0;
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,(error_code *)&timeout,1,0);
    local_88 = 1;
    goto LAB_00329707;
  }
  local_168 = libtorrent::aux::session_settings::get_int
                        ((this->super_peer_connection_hot_members).m_settings,0x401b);
  peVar10 = std::
            __shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_socket);
  bVar2 = libtorrent::aux::is_i2p(peVar10);
  iVar6 = 1;
  if (bVar2) {
    iVar6 = 4;
  }
  local_168 = iVar6 * local_168;
  local_382 = false;
  if (((local_121 & 1) != 0) &&
     (local_382 = false, ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)
     ) {
    uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
    local_382 = false;
    if ((uVar3 & 1) != 0) {
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_170,&local_168);
      local_382 = std::chrono::operator>(&stack0xffffffffffffff18,&local_170);
    }
  }
  if (local_382 != false) {
    local_178 = (_List_node_base *)tStack_e8.__r;
    uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)tStack_e8.__r);
    peer_log(this,info,"NO_HANDSHAKE","waited %d seconds",uVar14 & 0xffffffff);
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_188,timed_out_no_handshake,(type *)0x0);
    local_189 = 0;
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_188,1,0);
    local_88 = 1;
    goto LAB_00329707;
  }
  ptVar11 = std::
            max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      (&this->m_last_unchoke,&this->m_last_incoming_request);
  ptVar11 = std::
            max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      (ptVar11,&this->m_last_sent_payload);
  local_198 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&me.
                                  super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,ptVar11);
  local_3b9 = false;
  tStack_e8 = (type)local_198;
  if (((local_121 & 1) != 0) &&
     (local_3b9 = false, ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)
     ) {
    bVar2 = std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::empty
                      (&(this->m_requests).
                        super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      );
    local_3b9 = false;
    if ((bVar2) &&
       (((local_3b9 = false, this->m_reading_bytes == 0 &&
         (local_3b9 = false,
         ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 5 & 1) == 0)) &&
        (local_3b9 = false, (this->field_0x763 & 1) != 0)))) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
      local_3b9 = false;
      if (bVar2) {
        peVar7 = std::
                 __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        bVar2 = torrent::is_upload_only(peVar7);
        local_3b9 = false;
        if (bVar2) {
          local_1a4 = 0x3c;
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_1a0,&local_1a4);
          bVar2 = std::chrono::operator>(&stack0xffffffffffffff18,&local_1a0);
          local_3b9 = false;
          if (bVar2) {
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_1b8,timed_out_no_request,(type *)0x0);
            local_3b9 = can_disconnect(this,&local_1b8);
          }
        }
      }
    }
  }
  if (local_3b9 != false) {
    local_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tStack_e8.__r;
    uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)tStack_e8.__r);
    peer_log(this,info,"NO_REQUEST","waited %d seconds",uVar14 & 0xffffffff);
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_1d0,timed_out_no_request,(type *)0x0);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_1d0,1,0);
    local_88 = 1;
    goto LAB_00329707;
  }
  d2.__r = (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&me.
                               super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,&this->m_became_uninterested);
  time_limit.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&me.
                           super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,&this->m_became_uninteresting);
  local_1fc.m_val =
       libtorrent::aux::session_settings::get_int
                 ((this->super_peer_connection_hot_members).m_settings,0x4013);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_1f8,(int *)&local_1fc);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_1f0,&local_1f8);
  local_3f5 = false;
  if ((((local_121 & 1) != 0) &&
      (local_3f5 = false, ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 4 & 1) == 0
      )) && (local_3f5 = false, (this->field_0x763 & 1) == 0)) {
    bVar2 = std::chrono::operator>(&d2,&local_1f0);
    local_3f5 = false;
    if (bVar2) {
      bVar2 = std::chrono::operator>(&time_limit,&local_1f0);
      local_3f5 = false;
      if (bVar2) {
        iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x1e])();
        iVar4 = libtorrent::aux::session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4055);
        if (iVar6 < iVar4) {
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
          local_3f5 = false;
          if (bVar2) {
            peVar7 = std::
                     __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            iVar6 = torrent::num_peers(peVar7);
            peVar7 = std::
                     __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            iVar4 = torrent::max_connections(peVar7);
            local_3f5 = false;
            if (iVar4 <= iVar6) goto LAB_00328f4d;
          }
        }
        else {
LAB_00328f4d:
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_210,timed_out_no_interest,(type *)0x0);
          local_3f5 = can_disconnect(this,&local_210);
        }
      }
    }
  }
  if (local_3f5 == false) {
    local_441 = false;
    if ((local_121 & 1) != 0) {
      bVar2 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
              empty(&(this->m_download_queue).
                     super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                   );
      local_441 = false;
      if ((!bVar2) && (local_441 = false, 0 < this->m_quota[1])) {
        local_24c = request_timeout(this);
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_248,&local_24c);
        local_240 = std::chrono::operator+(&this->m_requested,&local_248);
        local_441 = std::chrono::operator>
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&me.
                                   super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,&local_240);
      }
    }
    if (local_441 != false) {
      snub_peer(this);
    }
    keep_alive(this);
    if ((((((byte)this->field_0x763 >> 4 & 1) != 0) &&
         ((*(ushort *)&this->field_0x761 >> 0xe & 1) == 0)) && (0 < this->m_downloaded_last_second))
       && (iVar6 = this->m_downloaded_last_second,
          iVar4 = stat::last_payload_downloaded(&this->m_statistics), iVar4 <= iVar6 + 5000)) {
      this->field_0x763 = this->field_0x763 & 0xef;
      bVar2 = should_log(this,info);
      if (bVar2) {
        uVar3 = this->m_downloaded_last_second;
        uVar5 = stat::last_payload_downloaded(&this->m_statistics);
        peer_log(this,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",(ulong)uVar3,
                 (ulong)uVar5);
      }
    }
    iVar6 = stat::last_payload_downloaded(&this->m_statistics);
    this->m_downloaded_last_second = iVar6;
    iVar6 = stat::last_payload_uploaded(&this->m_statistics);
    this->m_uploaded_last_second = iVar6;
    stat::second_tick(&this->m_statistics,tick_interval_ms);
    iVar6 = stat::upload_payload_rate(&this->m_statistics);
    if (this->m_upload_rate_peak < iVar6) {
      iVar6 = stat::upload_payload_rate(&this->m_statistics);
      this->m_upload_rate_peak = iVar6;
    }
    iVar6 = stat::download_payload_rate(&this->m_statistics);
    if (this->m_download_rate_peak < iVar6) {
      iVar6 = stat::download_payload_rate(&this->m_statistics);
      this->m_download_rate_peak = iVar6;
    }
    uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    if ((uVar3 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      bVar2 = torrent::ready_for_connections(peVar7);
      if (bVar2) {
        update_desired_queue_size(this);
        if ((uint)this->m_desired_queue_size == this->m_max_out_request_queue) {
          peVar7 = std::
                   __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          paVar8 = torrent::alerts(peVar7);
          bVar2 = alert_manager::should_post<libtorrent::performance_alert>(paVar8);
          if (bVar2) {
            peVar7 = std::
                     __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            paVar8 = torrent::alerts(peVar7);
            std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
            torrent::get_handle((torrent *)&piece_timeout);
            local_268[1] = 1;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      (paVar8,(torrent_handle *)&piece_timeout,
                       (performance_warning_t *)(local_268 + 1));
            torrent_handle::~torrent_handle((torrent_handle *)&piece_timeout);
          }
        }
        local_268[0] = libtorrent::aux::session_settings::get_int
                                 ((this->super_peer_connection_hot_members).m_settings,0x4004);
        bVar2 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
                empty(&(this->m_download_queue).
                       super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                     );
        local_4ad = false;
        if ((!bVar2) && (local_4ad = false, 0 < this->m_quota[1])) {
          local_270.__r =
               (rep)std::chrono::operator-
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&me.
                                   super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,&this->m_last_piece);
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_278,local_268);
          local_4ad = std::chrono::operator>(&local_270,&local_278);
        }
        if (local_4ad != false) {
          bVar2 = should_log(this,info);
          if (bVar2) {
            sVar13 = std::
                     vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
                     size(&(this->m_download_queue).
                           super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                         );
            td = std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&me.
                                super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,&this->m_last_piece);
            uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)td.__r);
            peer_log(this,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",sVar13 & 0xffffffff,
                     uVar14 & 0xffffffff,local_268[0]);
          }
          snub_peer(this);
        }
        fill_send_buffer(this);
        local_88 = 0;
      }
      else {
        local_88 = 1;
      }
    }
    else {
      local_88 = 1;
    }
  }
  else {
    bVar2 = should_log(this,info);
    if (bVar2) {
      local_218._M_t.
      super___uniq_ptr_impl<libtorrent::peer_list,_std::default_delete<libtorrent::peer_list>_>._M_t
      .super__Tuple_impl<0UL,_libtorrent::peer_list_*,_std::default_delete<libtorrent::peer_list>_>.
      super__Head_base<0UL,_libtorrent::peer_list_*,_false>._M_head_impl =
           (__uniq_ptr_data<libtorrent::peer_list,_std::default_delete<libtorrent::peer_list>,_true,_true>
            )(__uniq_ptr_data<libtorrent::peer_list,_std::default_delete<libtorrent::peer_list>,_true,_true>
              )d2.__r;
      uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)d2.__r);
      local_220 = time_limit.__r;
      uVar12 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)time_limit.__r);
      peer_log(this,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",uVar14 & 0xffffffff,
               uVar12 & 0xffffffff);
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_230,timed_out_no_interest,(type *)0x0);
    local_231 = 0;
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_230,1,0);
    local_88 = 1;
  }
LAB_00329707:
  std::shared_ptr<libtorrent::torrent>::~shared_ptr((shared_ptr<libtorrent::torrent> *)local_40);
  std::shared_ptr<libtorrent::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::peer_connection> *)
             &t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = m_torrent.lock();

		int warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if ((warning & (1 << channel)) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request)
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request = now;
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive;

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(*m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(*m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if we can't read, it means we're blocked on the rate-limiter
		// or the disk, not the peer itself. In this case, don't blame
		// the peer and disconnect it
		bool const may_timeout = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (may_timeout && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(*m_socket) ? 4 : 1;
#endif
		if (may_timeout
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke, m_last_incoming_request)
			, m_last_sent_payload);

		if (may_timeout
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested;
		time_duration const d2 = now - m_became_uninteresting;
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (may_timeout
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (m_ses.num_connections() >= m_settings.get_int(settings_pack::connections_limit)
				|| (t && t->num_peers() >= t->max_connections()))
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (may_timeout
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}